

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_resampler_process_pcm_frames
                    (ma_resampler *pResampler,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  _func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
  *UNRECOVERED_JUMPTABLE;
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pResampler != (ma_resampler *)0x0) &&
     (pFrameCountIn != (ma_uint64 *)0x0 || pFrameCountOut != (ma_uint64 *)0x0)) {
    mVar1 = MA_NOT_IMPLEMENTED;
    if ((pResampler->pBackendVTable != (ma_resampling_backend_vtable *)0x0) &&
       (UNRECOVERED_JUMPTABLE = pResampler->pBackendVTable->onProcess,
       UNRECOVERED_JUMPTABLE !=
       (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
        *)0x0)) {
      mVar1 = (*UNRECOVERED_JUMPTABLE)
                        (pResampler->pBackendUserData,pResampler->pBackend,pFramesIn,pFrameCountIn,
                         pFramesOut,pFrameCountOut);
      return mVar1;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_resampler_process_pcm_frames(ma_resampler* pResampler, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFrameCountOut == NULL && pFrameCountIn == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pResampler->pBackendVTable == NULL || pResampler->pBackendVTable->onProcess == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pResampler->pBackendVTable->onProcess(pResampler->pBackendUserData, pResampler->pBackend, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
}